

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getDefaultTimeZone_63(UChar *result,int32_t resultCapacity,UErrorCode *ec)

{
  UBool UVar1;
  Char16Ptr local_88 [3];
  undefined1 local_70 [8];
  UnicodeString id;
  TimeZone *zone;
  int32_t len;
  UErrorCode *ec_local;
  int32_t resultCapacity_local;
  UChar *result_local;
  
  zone._4_4_ = 0;
  if ((ec != (UErrorCode *)0x0) && (UVar1 = U_SUCCESS(*ec), UVar1 != '\0')) {
    id.fUnion._48_8_ = icu_63::TimeZone::createDefault();
    if ((TimeZone *)id.fUnion._48_8_ == (TimeZone *)0x0) {
      *ec = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_70);
      icu_63::TimeZone::getID((TimeZone *)id.fUnion._48_8_,(UnicodeString *)local_70);
      if (id.fUnion._48_8_ != 0) {
        (**(code **)(*(long *)id.fUnion._48_8_ + 8))();
      }
      icu_63::Char16Ptr::Char16Ptr(local_88,result);
      zone._4_4_ = icu_63::UnicodeString::extract
                             ((UnicodeString *)local_70,local_88,resultCapacity,ec);
      icu_63::Char16Ptr::~Char16Ptr(local_88);
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_70);
    }
  }
  return zone._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getDefaultTimeZone(UChar* result, int32_t resultCapacity, UErrorCode* ec) {
    int32_t len = 0;
    if (ec!=NULL && U_SUCCESS(*ec)) {
        TimeZone* zone = TimeZone::createDefault();
        if (zone == NULL) {
            *ec = U_MEMORY_ALLOCATION_ERROR;
        } else {
            UnicodeString id;
            zone->getID(id);
            delete zone;
            len = id.extract(result, resultCapacity, *ec);
        }
    }
    return len;
}